

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_4.h
# Opt level: O1

int __thiscall
PlayerMike_4::select
          (PlayerMike_4 *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (int)__readfds + __nfds;
  iVar1 = rand();
  iVar3 = (int)__writefds + iVar2;
  if (iVar3 == 0) {
    iVar3 = iVar1 % 3;
  }
  else {
    iVar1 = iVar1 % iVar3;
    iVar3 = 0;
    if (__nfds <= iVar1) {
      iVar3 = (iVar2 <= iVar1) + 1;
    }
  }
  return iVar3;
}

Assistant:

int select(int val0, int val1, int val2)
   {
#ifdef DEBUG
      std::cout << "vals=" << val0 << ", " << val1 << ", " << val2 << std::endl;
#endif
      int sum = val0+val1+val2;
      if (sum == 0)
         return rand() % 3;

      int r = rand()%sum;
      if (r < val0)
         return 0;
      if (r < val0+val1)
         return 1;
      return 2;
   }